

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O1

int __thiscall gl4cts::SparseTextureTests::init(SparseTextureTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TextureParameterQueriesTestCase *this_00;
  InternalFormatQueriesTestCase *this_01;
  TestNode *node;
  SparseTextureAllocationTestCase *this_02;
  SparseTextureCommitmentTestCase *pSVar2;
  
  this_00 = (TextureParameterQueriesTestCase *)operator_new(0x230);
  TextureParameterQueriesTestCase::TextureParameterQueriesTestCase
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (InternalFormatQueriesTestCase *)operator_new(0x230);
  InternalFormatQueriesTestCase::InternalFormatQueriesTestCase
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  node = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)node,pCVar1->m_testCtx,"SimpleQueries",
             "Implements Get* queries tests described in CTS_ARB_sparse_texture");
  node[1]._vptr_TestNode = (_func_int **)pCVar1;
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_02128118;
  tcu::TestNode::addChild((TestNode *)this,node);
  this_02 = (SparseTextureAllocationTestCase *)operator_new(0x248);
  SparseTextureAllocationTestCase::SparseTextureAllocationTestCase
            (this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  pSVar2 = (SparseTextureCommitmentTestCase *)operator_new(0x260);
  SparseTextureCommitmentTestCase::SparseTextureCommitmentTestCase
            (pSVar2,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (SparseTextureCommitmentTestCase *)operator_new(0x260);
  SparseTextureCommitmentTestCase::SparseTextureCommitmentTestCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"SparseDSATextureCommitment",
             "Verifies texturePageCommitmentEXT functionality added in CTS_ARB_sparse_texture");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SparseTextureCommitmentTestCase_02128220;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  return extraout_EAX;
}

Assistant:

void SparseTextureTests::init()
{
	addChild(new TextureParameterQueriesTestCase(m_context));
	addChild(new InternalFormatQueriesTestCase(m_context));
	addChild(new SimpleQueriesTestCase(m_context));
	addChild(new SparseTextureAllocationTestCase(m_context));
	addChild(new SparseTextureCommitmentTestCase(m_context));
	addChild(new SparseDSATextureCommitmentTestCase(m_context));
}